

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

TPZFMatrix<Fad<long_double>_> * __thiscall
TPZFMatrix<Fad<long_double>_>::NewMatrix(TPZFMatrix<Fad<long_double>_> *this)

{
  TPZFMatrix<Fad<long_double>_> *pTVar1;
  TPZFMatrix<Fad<long_double>_> *in_stack_00000010;
  
  pTVar1 = (TPZFMatrix<Fad<long_double>_> *)operator_new(0x90);
  TPZFMatrix(in_stack_00000010);
  return pTVar1;
}

Assistant:

inline TPZFMatrix<TVar>*NewMatrix() const override {return new TPZFMatrix<TVar>{};}